

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdInParse.cpp
# Opt level: O3

int main(int argC,char **argV)

{
  char cVar1;
  int iVar2;
  SAXParser *this;
  size_t sVar3;
  ostream *poVar4;
  char *pcVar5;
  char *pcVar6;
  bool bVar7;
  ulong uVar8;
  StdInParseHandlers handler;
  StdInInputSource src;
  StrX local_a8;
  StdInParseHandlers local_a0;
  undefined **local_60 [4];
  wchar16 *local_40;
  
  pcVar6 = (char *)0x0;
  xercesc_4_0::XMLPlatformUtils::Initialize
            ((char *)&xercesc_4_0::XMLUni::fgXercescDefaultLocale,(char *)0x0,(PanicHandler *)0x0,
             (MemoryManager *)0x0);
  if (1 < argC) {
    uVar8 = 1;
    do {
      pcVar5 = argV[uVar8];
      if (*pcVar5 != '-') break;
      if ((pcVar5[1] == '?') && (pcVar5[2] == '\0')) {
        usage();
LAB_00103899:
        xercesc_4_0::XMLPlatformUtils::Terminate();
        return 2;
      }
      if (((pcVar5[1] == 'v') && (pcVar5[2] == '=')) || ((pcVar5[1] == 'V' && (pcVar5[2] == '='))))
      {
        pcVar5 = pcVar5 + 3;
        pcVar6 = "never";
        iVar2 = strcmp(pcVar5,"never");
        if (iVar2 == 0) {
          valScheme = Val_Never;
        }
        else {
          pcVar6 = "auto";
          iVar2 = strcmp(pcVar5,"auto");
          if (iVar2 == 0) {
            valScheme = Val_Auto;
          }
          else {
            pcVar6 = "always";
            iVar2 = strcmp(pcVar5,"always");
            if (iVar2 != 0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"Unknown -v= value: ",0x13);
              sVar3 = strlen(pcVar5);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar5,sVar3)
              ;
              std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'x');
              std::ostream::put('x');
              std::ostream::flush();
              goto LAB_00103899;
            }
            valScheme = Val_Always;
          }
        }
      }
      else if (((pcVar5[1] == 'n') && (pcVar5[2] == '\0')) ||
              ((pcVar5[1] == 'N' && (pcVar5[2] == '\0')))) {
        doNamespaces = 1;
      }
      else if (((pcVar5[1] == 's') && (pcVar5[2] == '\0')) ||
              ((pcVar5[1] == 'S' && (pcVar5[2] == '\0')))) {
        doSchema = 1;
      }
      else if (((pcVar5[1] == 'f') && (pcVar5[2] == '\0')) ||
              ((pcVar5[1] == 'F' && (pcVar5[2] == '\0')))) {
        schemaFullChecking = 1;
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Unknown option \'",0x10);
        pcVar6 = argV[uVar8];
        if (pcVar6 == (char *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x109178);
        }
        else {
          sVar3 = strlen(pcVar6);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar6,sVar3);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"\', ignoring it\n",0xf);
        cVar1 = std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'x');
        pcVar6 = (char *)(ulong)(uint)(int)cVar1;
        std::ostream::put('x');
        std::ostream::flush();
      }
      uVar8 = uVar8 + 1;
    } while ((uint)argC != uVar8);
  }
  this = (SAXParser *)xercesc_4_0::XMemory::operator_new((XMemory *)0x108,(ulong)pcVar6);
  xercesc_4_0::SAXParser::SAXParser
            (this,(XMLValidator *)0x0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager,
             (XMLGrammarPool *)0x0);
  xercesc_4_0::SAXParser::setValidationScheme((ValSchemes)this);
  bVar7 = SUB81(this,0);
  xercesc_4_0::SAXParser::setDoNamespaces(bVar7);
  xercesc_4_0::SAXParser::setDoSchema(bVar7);
  xercesc_4_0::SAXParser::setHandleMultipleImports(bVar7);
  xercesc_4_0::SAXParser::setValidationSchemaFullChecking(bVar7);
  StdInParseHandlers::StdInParseHandlers(&local_a0);
  (**(code **)(*(long *)this + 0x20))(this,&local_a0.super_HandlerBase.super_DocumentHandler);
  (**(code **)(*(long *)this + 0x28))(this,&local_a0.super_HandlerBase.super_ErrorHandler);
  xercesc_4_0::InputSource::InputSource
            ((InputSource *)local_60,"stdin",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_60[0] = &PTR__InputSource_00107ad8;
  xercesc_4_0::XMLPlatformUtils::getCurrentMillis();
  (**(code **)(*(long *)this + 0x30))(this,local_60);
  xercesc_4_0::XMLPlatformUtils::getCurrentMillis();
  iVar2 = xercesc_4_0::SAXParser::getErrorCount();
  if (iVar2 == 0) {
    pcVar6 = (char *)xercesc_4_0::XMLString::transcode
                               (local_40,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_a8.fLocalForm = pcVar6;
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x109060);
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar6,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,": ",2);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ms (",5);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," elems, ",8);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," attrs, ",8);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," spaces, ",9);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," chars)",7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    StrX::~StrX(&local_a8);
  }
  xercesc_4_0::InputSource::~InputSource((InputSource *)local_60);
  (**(code **)(*(long *)this + 8))(this);
  xercesc_4_0::XMLPlatformUtils::Terminate();
  StdInParseHandlers::~StdInParseHandlers(&local_a0);
  return (uint)(0 < iVar2) << 2;
}

Assistant:

int main(int argC, char* argV[])
{
    // Initialize the XML4C system
    try
    {
         XMLPlatformUtils::Initialize();
    }

    catch (const XMLException& toCatch)
    {
         std::cerr << "Error during initialization! Message:\n"
              << StrX(toCatch.getMessage()) << std::endl;
         return 1;
    }

    int parmInd;
    for (parmInd = 1; parmInd < argC; parmInd++)
    {
        // Break out on first parm not starting with a dash
        if (argV[parmInd][0] != '-')
            break;

        // Watch for special case help request
        if (!strcmp(argV[parmInd], "-?"))
        {
            usage();
            XMLPlatformUtils::Terminate();
            return 2;
        }
         else if (!strncmp(argV[parmInd], "-v=", 3)
              ||  !strncmp(argV[parmInd], "-V=", 3))
        {
            const char* const parm = &argV[parmInd][3];

            if (!strcmp(parm, "never"))
                valScheme = SAXParser::Val_Never;
            else if (!strcmp(parm, "auto"))
                valScheme = SAXParser::Val_Auto;
            else if (!strcmp(parm, "always"))
                valScheme = SAXParser::Val_Always;
            else
            {
                std::cerr << "Unknown -v= value: " << parm << std::endl;
                XMLPlatformUtils::Terminate();
                return 2;
            }
        }
         else if (!strcmp(argV[parmInd], "-n")
              ||  !strcmp(argV[parmInd], "-N"))
        {
            doNamespaces = true;
        }
         else if (!strcmp(argV[parmInd], "-s")
              ||  !strcmp(argV[parmInd], "-S"))
        {
            doSchema = true;
        }
         else if (!strcmp(argV[parmInd], "-f")
              ||  !strcmp(argV[parmInd], "-F"))
        {
            schemaFullChecking = true;
        }
         else
        {
            std::cerr << "Unknown option '" << argV[parmInd]
                 << "', ignoring it\n" << std::endl;
        }
    }

    //
    //  Create a SAX parser object. Then, according to what we were told on
    //  the command line, set the options.
    //
    SAXParser* parser = new SAXParser;
    parser->setValidationScheme(valScheme);
    parser->setDoNamespaces(doNamespaces);
    parser->setDoSchema(doSchema);
    parser->setHandleMultipleImports (true);
    parser->setValidationSchemaFullChecking(schemaFullChecking);


    //
    //  Create our SAX handler object and install it on the parser, as the
    //  document and error handler. We are responsible for cleaning them
    //  up, but since its just stack based here, there's nothing special
    //  to do.
    //
    StdInParseHandlers handler;
    parser->setDocumentHandler(&handler);
    parser->setErrorHandler(&handler);

    unsigned long duration;
    int errorCount = 0;
    // create a faux scope so that 'src' destructor is called before
    // XMLPlatformUtils::Terminate
    {
        //
        //  Kick off the parse and catch any exceptions. Create a standard
        //  input input source and tell the parser to parse from that.
        //
        StdInInputSource src;
        try
        {
            const unsigned long startMillis = XMLPlatformUtils::getCurrentMillis();
            parser->parse(src);
            const unsigned long endMillis = XMLPlatformUtils::getCurrentMillis();
            duration = endMillis - startMillis;
            errorCount = parser->getErrorCount();
        }
        catch (const OutOfMemoryException&)
        {
            std::cerr << "OutOfMemoryException" << std::endl;
            errorCount = 2;
            return 4;
        }
        catch (const XMLException& e)
        {
            std::cerr << "\nError during parsing: \n"
                 << StrX(e.getMessage())
                 << "\n" << std::endl;
            errorCount = 1;
            return 4;
        }

        // Print out the stats that we collected and time taken
        if (!errorCount) {
            std::cout << StrX(src.getSystemId()) << ": " << duration << " ms ("
                 << handler.getElementCount() << " elems, "
                 << handler.getAttrCount() << " attrs, "
                 << handler.getSpaceCount() << " spaces, "
                 << handler.getCharacterCount() << " chars)" << std::endl;
        }
    }

    //
    //  Delete the parser itself.  Must be done prior to calling Terminate, below.
    //
    delete parser;

    XMLPlatformUtils::Terminate();

    if (errorCount > 0)
        return 4;
    else
        return 0;
}